

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O0

void master_table_delete_dictionary
               (planck_unit_test_t *tc,MasterTable *master_table,Dictionary<int,_int> *dictionary)

{
  planck_unit_result_t pVar1;
  undefined1 local_48 [8];
  ion_dictionary_config_info_t config;
  ion_err_t err;
  ion_dictionary_id_t id;
  Dictionary<int,_int> *dictionary_local;
  MasterTable *master_table_local;
  planck_unit_test_t *tc_local;
  
  config._28_4_ = ((dictionary->dict).instance)->id;
  config.dictionary_type._3_1_ = MasterTable::deleteDictionary<int,int>(master_table,dictionary);
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(char)config.dictionary_type._3_1_,0xc9,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  config.dictionary_type._3_1_ =
       MasterTable::lookupMasterTable
                 (master_table,config._28_4_,(ion_dictionary_config_info_t *)local_48);
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,1,(int)(char)config.dictionary_type._3_1_,0xce,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  return;
}

Assistant:

void
master_table_delete_dictionary(
	planck_unit_test_t *tc,
	MasterTable *master_table,
	Dictionary<int, int>	*dictionary
) {
	ion_dictionary_id_t id	= dictionary->dict.instance->id;

	ion_err_t err			= master_table->deleteDictionary(dictionary);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);

	ion_dictionary_config_info_t config;

	err = master_table->lookupMasterTable(id, &config);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_item_not_found, err);
}